

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::Engine::Put(Engine *this,VariableNT *variable,void *data,Mode launch)

{
  DataType DVar1;
  DataType DVar2;
  undefined4 in_ECX;
  Mode in_EDX;
  long *in_RSI;
  undefined8 *in_RDI;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"in call to Engine::Put",&local_41);
  helper::CheckForNullptr<adios2::core::Engine>
            ((Engine *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"for variable in call to Engine::Put",&local_79);
  helper::CheckForNullptr<adios2::core::VariableBase>
            ((VariableBase *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<std::__cxx11::string>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<std::__cxx11::string>((Variable *)*in_RDI,(string *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<char>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<char>((Variable *)*in_RDI,(char *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<signed_char>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<signed_char>((Variable *)*in_RDI,(signed *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<short>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<short>((Variable *)*in_RDI,(short *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<int>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<int>((Variable *)*in_RDI,(int *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<long>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<long>((Variable *)*in_RDI,(long *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<unsigned_char>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<unsigned_char>((Variable *)*in_RDI,(uchar *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<unsigned_short>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<unsigned_short>((Variable *)*in_RDI,(ushort *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<unsigned_int>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<unsigned_int>((Variable *)*in_RDI,(uint *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<unsigned_long>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<unsigned_long>((Variable *)*in_RDI,(ulong *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<float>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<float>((Variable *)*in_RDI,(float *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<double>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<double>((Variable *)*in_RDI,(double *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<long_double>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<long_double>((Variable *)*in_RDI,(longdouble *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<std::complex<float>>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<std::complex<float>>((Variable *)*in_RDI,(complex *)*in_RSI,in_EDX);
  }
  DVar1 = *(DataType *)(*in_RSI + 0x28);
  DVar2 = helper::GetDataType<std::complex<double>>();
  if (DVar1 == DVar2) {
    adios2::core::Engine::Put<std::complex<double>>((Variable *)*in_RDI,(complex *)*in_RSI,in_EDX);
  }
  else if (*(int *)(*in_RSI + 0x28) == 0x10) {
    adios2::core::Engine::Put((VariableStruct *)*in_RDI,(void *)*in_RSI,in_EDX);
  }
  return;
}

Assistant:

void Engine::Put(VariableNT &variable, const void *data, const Mode launch)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Put");
    helper::CheckForNullptr(variable.m_Variable, "for variable in call to Engine::Put");
#define declare_type(T)                                                                            \
    if (variable.m_Variable->m_Type == helper::GetDataType<T>())                                   \
    {                                                                                              \
        m_Engine->Put(*reinterpret_cast<core::Variable<T> *>(variable.m_Variable),                 \
                      reinterpret_cast<const T *>(data), launch);                                  \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (variable.m_Variable->m_Type == DataType::Struct)
    {
        m_Engine->Put(*reinterpret_cast<core::VariableStruct *>(variable.m_Variable), data, launch);
    }
}